

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg_ctr.c
# Opt level: O0

int drbg_ctr_new(PROV_DRBG *drbg)

{
  void *pvVar1;
  PROV_DRBG *in_RDI;
  PROV_DRBG_CTR *ctr;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  pvVar1 = CRYPTO_secure_zalloc
                     (CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)in_RDI,
                      (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (pvVar1 == (void *)0x0) {
    ERR_new();
    ERR_set_debug((char *)ctr,in_stack_fffffffffffffffc,(char *)in_RDI);
    ERR_set_error(0x39,0xc0100,(char *)0x0);
    iVar2 = 0;
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x30) = 1;
    in_RDI->data = pvVar1;
    iVar2 = drbg_ctr_init_lengths(in_RDI);
  }
  return iVar2;
}

Assistant:

static int drbg_ctr_new(PROV_DRBG *drbg)
{
    PROV_DRBG_CTR *ctr;

    ctr = OPENSSL_secure_zalloc(sizeof(*ctr));
    if (ctr == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    ctr->use_df = 1;
    drbg->data = ctr;
    return drbg_ctr_init_lengths(drbg);
}